

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# property.cpp
# Opt level: O0

bool __thiscall ccs::Value::asBool(Value *this)

{
  bool bVar1;
  Caster<bool> local_18;
  Value *local_10;
  Value *this_local;
  
  local_10 = this;
  anon_unknown_0::Caster<bool>::Caster(&local_18,this);
  bVar1 = accept<bool,ccs::(anonymous_namespace)::Caster<bool>>(this,&local_18);
  return bVar1;
}

Assistant:

bool Value::asBool() const
  { return accept<bool>(Caster<bool>(*this)); }